

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hadamard.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::Hadamard<std::complex<float>_>::matrix(Hadamard<std::complex<float>_> *this)

{
  complex<float> in_RCX;
  complex<float> m01;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  double dVar1;
  SquareMatrix<std::complex<float>_> SVar2;
  complex<float> local_3c;
  complex<float> local_34;
  complex<float> local_2c;
  complex<float> local_24;
  float local_1c;
  R sqrt2;
  Hadamard<std::complex<float>_> *this_local;
  
  this_local = this;
  dVar1 = std::sqrt(5.30498947741318e-315);
  local_1c = 1.0 / SUB84(dVar1,0);
  std::complex<float>::complex(&local_24,local_1c,0.0);
  std::complex<float>::complex(&local_2c,local_1c,0.0);
  std::complex<float>::complex(&local_34,local_1c,0.0);
  std::complex<float>::complex(&local_3c,-local_1c,0.0);
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,in_RSI,m01,in_RCX,in_R8);
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using R = qclab::real_t< T > ;
          const R sqrt2 = R(1) / std::sqrt( R(2) ) ;
          return qclab::dense::SquareMatrix< T >( sqrt2 ,  sqrt2 ,
                                                  sqrt2 , -sqrt2 ) ;
        }